

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inBeforeToken(Tokenizer *this,char ch)

{
  bool bVar1;
  char ch_local;
  Tokenizer *this_local;
  
  bVar1 = isSpace(this,ch);
  if (bVar1) {
    this->before_token = (bool)((this->include_ignorable ^ 0xffU) & 1);
    this->in_token = (bool)(this->include_ignorable & 1);
    if ((this->include_ignorable & 1U) != 0) {
      this->state = st_in_space;
    }
  }
  else if (ch == '%') {
    this->before_token = (bool)((this->include_ignorable ^ 0xffU) & 1);
    this->in_token = (bool)(this->include_ignorable & 1);
    this->state = st_in_comment;
  }
  else {
    this->before_token = false;
    this->in_token = true;
    inTop(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inBeforeToken(char ch)
{
    // Note: we specifically do not use ctype here.  It is locale-dependent.
    if (isSpace(ch)) {
        before_token = !include_ignorable;
        in_token = include_ignorable;
        if (include_ignorable) {
            state = st_in_space;
        }
    } else if (ch == '%') {
        before_token = !include_ignorable;
        in_token = include_ignorable;
        state = st_in_comment;
    } else {
        before_token = false;
        in_token = true;
        inTop(ch);
    }
}